

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_tile.c
# Opt level: O1

uint32_t TIFFNumberOfTiles(TIFF *tif)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  uint uVar5;
  uint32_t uVar6;
  
  uVar5 = (tif->tif_dir).td_tilewidth;
  uVar3 = (tif->tif_dir).td_tilelength;
  if (uVar5 == 0xffffffff) {
    uVar5 = (tif->tif_dir).td_imagewidth;
  }
  uVar2 = (tif->tif_dir).td_tiledepth;
  if (uVar3 == 0xffffffff) {
    uVar3 = (tif->tif_dir).td_imagelength;
  }
  if (uVar2 == 0xffffffff) {
    uVar2 = (tif->tif_dir).td_imagedepth;
  }
  uVar4 = 0;
  if (uVar2 != 0 && (uVar3 != 0 && uVar5 != 0)) {
    uVar1 = (tif->tif_dir).td_imagewidth;
    uVar6 = 0;
    uVar4 = 0;
    if (uVar1 < -uVar5) {
      uVar4 = ((uVar1 + uVar5) - 1) / uVar5;
    }
    uVar5 = (tif->tif_dir).td_imagelength;
    if (uVar5 < -uVar3) {
      uVar6 = ((uVar5 + uVar3) - 1) / uVar3;
    }
    uVar4 = _TIFFMultiply32(tif,uVar4,uVar6,"TIFFNumberOfTiles");
    uVar5 = (tif->tif_dir).td_imagedepth;
    uVar6 = 0;
    if (uVar5 < -uVar2) {
      uVar6 = ((uVar5 + uVar2) - 1) / uVar2;
    }
    uVar4 = _TIFFMultiply32(tif,uVar4,uVar6,"TIFFNumberOfTiles");
  }
  if ((tif->tif_dir).td_planarconfig == 2) {
    uVar2 = _TIFFMultiply32(tif,uVar4,(uint)(tif->tif_dir).td_samplesperpixel,"TIFFNumberOfTiles");
    return uVar2;
  }
  return uVar4;
}

Assistant:

uint32_t TIFFNumberOfTiles(TIFF *tif)
{
    TIFFDirectory *td = &tif->tif_dir;
    uint32_t dx = td->td_tilewidth;
    uint32_t dy = td->td_tilelength;
    uint32_t dz = td->td_tiledepth;
    uint32_t ntiles;

    if (dx == (uint32_t)-1)
        dx = td->td_imagewidth;
    if (dy == (uint32_t)-1)
        dy = td->td_imagelength;
    if (dz == (uint32_t)-1)
        dz = td->td_imagedepth;
    ntiles =
        (dx == 0 || dy == 0 || dz == 0)
            ? 0
            : _TIFFMultiply32(
                  tif,
                  _TIFFMultiply32(tif, TIFFhowmany_32(td->td_imagewidth, dx),
                                  TIFFhowmany_32(td->td_imagelength, dy),
                                  "TIFFNumberOfTiles"),
                  TIFFhowmany_32(td->td_imagedepth, dz), "TIFFNumberOfTiles");
    if (td->td_planarconfig == PLANARCONFIG_SEPARATE)
        ntiles = _TIFFMultiply32(tif, ntiles, td->td_samplesperpixel,
                                 "TIFFNumberOfTiles");
    return (ntiles);
}